

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

string * __thiscall
Json::OurReader::getLocationLineAndColumn_abi_cxx11_
          (string *__return_storage_ptr__,OurReader *this,Location location)

{
  allocator local_61;
  int column;
  int line;
  char buffer [51];
  
  getLocationLineAndColumn(this,location,&line,&column);
  snprintf(buffer,0x33,"Line %d, Column %d",(ulong)(uint)line,(ulong)(uint)column);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_61);
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING OurReader::getLocationLineAndColumn(Location location) const {
  int line, column;
  getLocationLineAndColumn(location, line, column);
  char buffer[18 + 16 + 16 + 1];
  snprintf(buffer, sizeof(buffer), "Line %d, Column %d", line, column);
  return buffer;
}